

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  byte bVar6;
  char cVar7;
  byte bVar8;
  ImDrawListSplitter *pIVar9;
  ImGuiTableColumn *pIVar10;
  ImDrawCmd *pIVar11;
  undefined8 uVar12;
  bool bVar13;
  undefined1 auVar14 [60];
  ImGuiContext *pIVar15;
  int iVar16;
  ImDrawChannel *pIVar17;
  int merge_group_n;
  ImDrawChannel *pIVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  byte bVar27;
  int iVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar34 [64];
  undefined1 auVar37 [64];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ImBitArray<132> remaining_mask;
  MergeGroup merge_groups [4];
  undefined1 local_108 [32];
  ulong local_e8;
  ulong local_e0;
  undefined1 local_d8 [8];
  float afStack_d0 [2];
  int iStack_c8;
  uint auStack_c4 [11];
  undefined1 auStack_98 [32];
  undefined1 local_78 [32];
  undefined1 auStack_58 [32];
  undefined1 auVar33 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  
  pIVar15 = GImGui;
  auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
  bVar6 = table->FreezeColumnsCount;
  pIVar9 = table->DrawSplitter;
  cVar7 = table->FreezeRowsCount;
  auStack_58 = (undefined1  [32])0x0;
  auStack_98 = ZEXT1632(ZEXT816(0) << 0x40);
  local_78 = (undefined1  [32])0x0;
  _local_d8 = auVar37;
  local_e0 = (ulong)table->ColumnsCount;
  if (0 < (long)local_e0) {
    uVar20 = 0;
    uVar23 = 0;
    local_e8 = table->VisibleMaskByIndex;
    do {
      if ((local_e8 >> (uVar20 & 0x3f) & 1) != 0) {
        pIVar17 = (pIVar9->_Channels).Data;
        uVar26 = 1;
        pIVar10 = (table->Columns).Data;
        do {
          bVar27 = (byte)uVar26;
          bVar8 = *(byte *)((long)&pIVar10[uVar20].Flags + ((ulong)uVar26 ^ 0x59));
          iVar16 = pIVar17[bVar8]._CmdBuffer.Size;
          if (0 < (long)iVar16) {
            pIVar18 = pIVar17 + bVar8;
            pIVar11 = (pIVar18->_CmdBuffer).Data;
            if (pIVar11[(long)iVar16 + -1].ElemCount == 0) {
              iVar16 = iVar16 + -1;
              (pIVar18->_CmdBuffer).Size = iVar16;
            }
            if (iVar16 == 1) {
              if ((pIVar10[uVar20].Flags & 0x100) == 0) {
                if (cVar7 < '\x01') {
                  fVar38 = pIVar10[uVar20].ContentMaxXUnfrozen;
LAB_002df6b4:
                  fVar2 = pIVar10[uVar20].ContentMaxXHeadersUsed;
                  uVar12 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar38),2);
                  bVar13 = (bool)((byte)uVar12 & 1);
                  auVar31._16_48_ = auVar37._16_48_;
                  auVar31._0_16_ = ZEXT416((uint)fVar2);
                  auVar37._4_60_ = auVar31._4_60_;
                  auVar37._0_4_ = (float)((uint)bVar13 * (int)fVar38 + (uint)!bVar13 * (int)fVar2);
                  fVar38 = auVar37._0_4_;
                }
                else {
                  if (bVar27 != 0) {
                    fVar38 = pIVar10[uVar20].ContentMaxXFrozen;
                    goto LAB_002df6b4;
                  }
                  fVar38 = pIVar10[uVar20].ContentMaxXUnfrozen;
                }
                if (pIVar10[uVar20].ClipRect.Max.x < fVar38) goto LAB_002df777;
              }
              uVar26 = ((byte)~bVar27 & 1) * 2;
              if (cVar7 < '\x01') {
                uVar26 = 2;
              }
              uVar26 = uVar26 | (bVar6 <= uVar20 || (char)bVar6 < '\x01');
              lVar21 = (ulong)uVar26 * 0x28;
              pfVar1 = (float *)(local_d8 + lVar21);
              iVar16 = *(int *)(local_d8 + lVar21 + 0x10);
              if (iVar16 == 0) {
                fVar38 = 3.4028235e+38;
                pfVar1[0] = 3.4028235e+38;
                pfVar1[1] = 3.4028235e+38;
                *(undefined8 *)(local_d8 + lVar21 + 8) = 0xff7fffffff7fffff;
              }
              else {
                fVar38 = *pfVar1;
              }
              *(uint *)(local_d8 + (ulong)(bVar8 >> 5) * 4 + lVar21 + 0x14) =
                   *(uint *)(local_d8 + (ulong)(bVar8 >> 5) * 4 + lVar21 + 0x14) |
                   1 << (bVar8 & 0x1f);
              *(int *)(local_d8 + lVar21 + 0x10) = iVar16 + 1;
              fVar2 = (pIVar11->ClipRect).x;
              if (fVar2 < fVar38) {
                *pfVar1 = fVar2;
              }
              fVar38 = (pIVar11->ClipRect).y;
              if (fVar38 < *(float *)(local_d8 + lVar21 + 4)) {
                *(float *)(local_d8 + lVar21 + 4) = fVar38;
              }
              fVar38 = (pIVar11->ClipRect).z;
              if (*(float *)(local_d8 + lVar21 + 8) < fVar38) {
                *(float *)(local_d8 + lVar21 + 8) = fVar38;
              }
              fVar38 = (pIVar11->ClipRect).w;
              if (*(float *)(local_d8 + lVar21 + 0xc) < fVar38) {
                *(float *)(local_d8 + lVar21 + 0xc) = fVar38;
              }
              uVar23 = uVar23 | 1 << uVar26;
            }
          }
LAB_002df777:
          uVar26 = 0;
        } while (('\0' < cVar7 & bVar27) != 0);
        pIVar10[uVar20].DrawChannelCurrent = 0xff;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != local_e0);
    if (uVar23 != 0) {
      iVar19 = pIVar9->_Count;
      iVar28 = (pIVar15->DrawChannelsTempMergeBuffer).Capacity;
      iVar16 = iVar19 + -2;
      if (iVar28 < iVar16) {
        if (iVar28 == 0) {
          iVar28 = 8;
        }
        else {
          iVar28 = iVar28 / 2 + iVar28;
        }
        if (iVar28 <= iVar16) {
          iVar28 = iVar16;
        }
        local_108._20_12_ = local_108._28_12_;
        pIVar17 = (ImDrawChannel *)MemAlloc((long)iVar28 << 5);
        pIVar18 = (pIVar15->DrawChannelsTempMergeBuffer).Data;
        if (pIVar18 != (ImDrawChannel *)0x0) {
          memcpy(pIVar17,pIVar18,(long)(pIVar15->DrawChannelsTempMergeBuffer).Size << 5);
          MemFree((pIVar15->DrawChannelsTempMergeBuffer).Data);
        }
        (pIVar15->DrawChannelsTempMergeBuffer).Data = pIVar17;
        (pIVar15->DrawChannelsTempMergeBuffer).Capacity = iVar28;
        iVar19 = pIVar9->_Count;
      }
      else {
        pIVar17 = (pIVar15->DrawChannelsTempMergeBuffer).Data;
      }
      (pIVar15->DrawChannelsTempMergeBuffer).Size = iVar16;
      local_108._0_16_ = ZEXT816(0);
      local_108._16_4_ = 0;
      ImBitArray<132>::SetBitRange((ImBitArray<132> *)local_108,2,iVar19);
      bVar8 = table->Bg2DrawChannelUnfrozen & 0x1f;
      *(uint *)(local_108 + (ulong)(table->Bg2DrawChannelUnfrozen >> 5) * 4) =
           *(uint *)(local_108 + (ulong)(table->Bg2DrawChannelUnfrozen >> 5) * 4) &
           (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
      uVar20 = 0;
      fVar38 = (table->HostClipRect).Min.x;
      fVar2 = (table->HostClipRect).Min.y;
      fVar3 = (table->HostClipRect).Max.x;
      fVar4 = (table->HostClipRect).Max.y;
      iVar16 = (pIVar9->_Count - (uint)('\0' < cVar7)) + -2;
      do {
        auVar33._16_48_ = auVar37._16_48_;
        iVar28 = *(int *)(local_d8 + uVar20 * 0x28 + 0x10);
        if (iVar28 != 0) {
          lVar21 = uVar20 * 0x28;
          auVar5 = *(undefined1 (*) [16])(local_d8 + lVar21);
          auVar39 = vminss_avx(auVar5,ZEXT416((uint)fVar38));
          auVar39._4_12_ = auVar5._4_12_;
          auVar40 = auVar39;
          if ('\0' < (char)bVar6) {
            auVar40 = auVar5;
          }
          if ((uVar20 & 1) != 0) {
            auVar39 = auVar40;
          }
          auVar5 = vmovshdup_avx(auVar39);
          auVar5 = vminss_avx(auVar5,ZEXT416((uint)fVar2));
          auVar5 = vinsertps_avx(auVar39,auVar5,0x10);
          if (cVar7 < '\x01') {
            auVar39 = auVar5;
          }
          if (uVar20 < 2) {
            auVar39 = auVar5;
          }
          if ((uVar20 & 1) != 0) {
            auVar5 = vshufpd_avx(auVar39,auVar39,1);
            uVar12 = vcmpss_avx512f(ZEXT416((uint)fVar3),auVar5,2);
            bVar13 = (bool)((byte)uVar12 & 1);
            auVar33._0_16_ = ZEXT416((uint)fVar3);
            auVar32._4_60_ = auVar33._4_60_;
            auVar32._0_4_ = (uint)bVar13 * auVar5._0_4_ + (uint)!bVar13 * (int)fVar3;
            auVar39 = vinsertps_avx(auVar39,auVar32._0_16_,0x20);
          }
          if ((1 < uVar20) && ((table->Flags & 0x20000) == 0)) {
            auVar5 = vshufps_avx(auVar39,auVar39,0xff);
            uVar12 = vcmpss_avx512f(ZEXT416((uint)fVar4),auVar5,2);
            bVar13 = (bool)((byte)uVar12 & 1);
            auVar35._16_48_ = auVar33._16_48_;
            auVar35._0_16_ = ZEXT416((uint)fVar4);
            auVar34._4_60_ = auVar35._4_60_;
            auVar34._0_4_ = (uint)bVar13 * auVar5._0_4_ + (uint)!bVar13 * (int)fVar4;
            auVar39 = vinsertps_avx(auVar39,auVar34._0_16_,0x30);
          }
          auVar36._32_32_ = auVar37._32_32_;
          iVar16 = iVar16 - iVar28;
          auVar29 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_d8 + lVar21 + 0x14));
          auVar30 = vmovdqu32_avx512vl(local_108);
          auVar36._0_32_ = ZEXT2032(auVar30._0_20_);
          auVar29 = vpandn_avx2(ZEXT2032(auVar29._0_20_),auVar36._0_32_);
          auVar14._4_56_ = auVar36._8_56_;
          auVar14._0_4_ = auVar30._4_4_;
          auVar37._0_32_ =
               ZEXT2032(CONCAT416(auVar30._16_4_,
                                  CONCAT412(auVar30._12_4_,
                                            CONCAT48(auVar30._8_4_,auVar14._0_8_ << 0x20))));
          auVar37._32_32_ = auVar36._32_32_;
          local_108 = vmovdqu32_avx512vl(auVar29);
          iVar19 = pIVar9->_Count;
          if (0 < iVar19) {
            auVar5 = vshufpd_avx(auVar39,auVar39,1);
            lVar24 = 8;
            uVar25 = 0;
            auVar5 = vunpcklpd_avx(auVar39,auVar5);
            do {
              uVar22 = uVar25 >> 5 & 0x7ffffff;
              if ((*(uint *)(local_d8 + uVar22 * 4 + lVar21 + 0x14) >> ((uint)uVar25 & 0x1f) & 1) !=
                  0) {
                iVar28 = iVar28 + -1;
                *(uint *)(local_d8 + uVar22 * 4 + lVar21 + 0x14) =
                     ~(1 << ((uint)uVar25 & 0x1f)) &
                     *(uint *)(local_d8 + uVar22 * 4 + lVar21 + 0x14);
                pIVar18 = (pIVar9->_Channels).Data;
                **(undefined1 (**) [16])((long)&(pIVar18->_CmdBuffer).Size + lVar24) = auVar5;
                *pIVar17 = *(ImDrawChannel *)((long)pIVar18 + lVar24 + -8);
                pIVar17 = pIVar17 + 1;
                iVar19 = pIVar9->_Count;
              }
              uVar25 = uVar25 + 1;
            } while (((long)uVar25 < (long)iVar19) && (lVar24 = lVar24 + 0x20, iVar28 != 0));
          }
        }
        if (uVar20 == 1 && '\0' < cVar7) {
          *pIVar17 = (pIVar9->_Channels).Data[table->Bg2DrawChannelUnfrozen];
          pIVar17 = pIVar17 + 1;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != 4);
      iVar28 = pIVar9->_Count;
      if ((0 < iVar28) && (iVar16 != 0)) {
        lVar21 = 0;
        uVar20 = 0;
        do {
          if ((*(uint *)(local_108 + (uVar20 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar20 & 0x1f) & 1) !=
              0) {
            iVar16 = iVar16 + -1;
            *pIVar17 = *(ImDrawChannel *)
                        ((long)&(((pIVar9->_Channels).Data)->_CmdBuffer).Size + lVar21);
            pIVar17 = pIVar17 + 1;
            iVar28 = pIVar9->_Count;
          }
          uVar20 = uVar20 + 1;
        } while (((long)uVar20 < (long)iVar28) && (lVar21 = lVar21 + 0x20, iVar16 != 0));
      }
      memcpy((pIVar9->_Channels).Data + 2,(pIVar15->DrawChannelsTempMergeBuffer).Data,
             (long)iVar28 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}